

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

h264_macroblock * h264_mb_nb_p(h264_slice *slice,h264_mb_pos pos,int inter)

{
  int iVar1;
  h264_macroblock *phVar2;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t mbaddr;
  uint local_1c;
  h264_macroblock *local_8;
  
  local_1c = *(uint *)(in_RDI + 0xc34);
  if (*(int *)(in_RDI + 0xc28) != 0) {
    local_1c = local_1c >> 1;
  }
  switch((h264_slice *)(ulong)in_ESI) {
  case (h264_slice *)0x0:
    return (h264_macroblock *)
           (*(long *)(in_RDI + 0xc40) + (ulong)*(uint *)(in_RDI + 0xc34) * 0x3774);
  case (h264_slice *)0x1:
    if (local_1c % *(uint *)(in_RDI + 0xc18) == 0) {
      phVar2 = h264_mb_unavail(in_EDX);
      return phVar2;
    }
    local_1c = local_1c - 1;
    break;
  case (h264_slice *)0x2:
    local_1c = local_1c - *(int *)(in_RDI + 0xc18);
    break;
  case (h264_slice *)0x3:
    if ((local_1c + 1) % *(uint *)(in_RDI + 0xc18) == 0) {
      phVar2 = h264_mb_unavail(in_EDX);
      return phVar2;
    }
    local_1c = local_1c - (*(int *)(in_RDI + 0xc18) + -1);
    break;
  case (h264_slice *)0x4:
    if (local_1c % *(uint *)(in_RDI + 0xc18) == 0) {
      phVar2 = h264_mb_unavail(in_EDX);
      return phVar2;
    }
    local_1c = local_1c - (*(int *)(in_RDI + 0xc18) + 1);
  }
  if (*(int *)(in_RDI + 0xc28) != 0) {
    local_1c = local_1c << 1;
  }
  iVar1 = h264_mb_avail((h264_slice *)(ulong)in_ESI,0);
  if (iVar1 == 0) {
    local_8 = h264_mb_unavail(in_EDX);
  }
  else {
    local_8 = (h264_macroblock *)(*(long *)(in_RDI + 0xc40) + (ulong)local_1c * 0x3774);
  }
  return local_8;
}

Assistant:

const struct h264_macroblock *h264_mb_nb_p(struct h264_slice *slice, enum h264_mb_pos pos, int inter) {
	uint32_t mbaddr = slice->curr_mb_addr;
	if (slice->mbaff_frame_flag)
		mbaddr /= 2;
	switch (pos) {
		case H264_MB_THIS:
			return &slice->mbs[slice->curr_mb_addr];
		case H264_MB_A:
			if ((mbaddr % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr--;
			break;
		case H264_MB_B:
			mbaddr -= slice->pic_width_in_mbs;
			break;
		case H264_MB_C:
			if (((mbaddr+1) % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr -= slice->pic_width_in_mbs - 1;
			break;
		case H264_MB_D:
			if ((mbaddr % slice->pic_width_in_mbs) == 0)
				return h264_mb_unavail(inter);
			mbaddr -= slice->pic_width_in_mbs + 1;
			break;
	}
	if (slice->mbaff_frame_flag)
		mbaddr *= 2;
	if (!h264_mb_avail(slice, mbaddr))
		return h264_mb_unavail(inter);
	return &slice->mbs[mbaddr];
}